

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O1

bool __thiscall
OpenMD::MoleculeStamp::addCutoffGroupStamp(MoleculeStamp *this,CutoffGroupStamp *cutoffgroup)

{
  pointer *pppCVar1;
  iterator __position;
  CutoffGroupStamp *local_8;
  
  __position._M_current =
       (this->cutoffGroupStamps_).
       super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->cutoffGroupStamps_).
      super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    local_8 = cutoffgroup;
    std::vector<OpenMD::CutoffGroupStamp*,std::allocator<OpenMD::CutoffGroupStamp*>>::
    _M_realloc_insert<OpenMD::CutoffGroupStamp*const&>
              ((vector<OpenMD::CutoffGroupStamp*,std::allocator<OpenMD::CutoffGroupStamp*>> *)
               &this->cutoffGroupStamps_,__position,&local_8);
  }
  else {
    *__position._M_current = cutoffgroup;
    pppCVar1 = &(this->cutoffGroupStamps_).
                super__Vector_base<OpenMD::CutoffGroupStamp_*,_std::allocator<OpenMD::CutoffGroupStamp_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppCVar1 = *pppCVar1 + 1;
  }
  return true;
}

Assistant:

bool MoleculeStamp::addCutoffGroupStamp(CutoffGroupStamp* cutoffgroup) {
    cutoffGroupStamps_.push_back(cutoffgroup);
    return true;
  }